

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::MinMaxTest_CompareReferenceAndVaryStride_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::MinMaxTest_CompareReferenceAndVaryStride_Test>
           *this)

{
  MinMaxTest *this_00;
  
  WithParamInterface<void(*)(unsigned_char_const*,int,unsigned_char_const*,int,int*,int*)>::
  parameter_ = &this->parameter_;
  this_00 = (MinMaxTest *)operator_new(0x28);
  anon_unknown.dwarf_1afbd7e::MinMaxTest::MinMaxTest(this_00);
  (this_00->
  super_TestWithParam<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_int_*,_int_*)>
  ).super_Test._vptr_Test = (_func_int **)&PTR__TestWithParam_00f55780;
  (this_00->
  super_TestWithParam<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_int_*,_int_*)>
  ).
  super_WithParamInterface<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_int_*,_int_*)>
  ._vptr_WithParamInterface =
       (_func_int **)&PTR__MinMaxTest_CompareReferenceAndVaryStride_Test_00f557c0;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }